

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

int Path::rmdir(char *__path)

{
  size_t __maxlen;
  int iVar1;
  char *pcVar2;
  DIR *__dirp;
  size_t sVar3;
  dirent *pdVar4;
  size_t sVar5;
  char *pcVar6;
  Path local_2100;
  undefined1 local_20e0 [8];
  stat statbuf;
  undefined1 local_2040 [8];
  StackBuffer<4096UL,_char> buffer;
  size_t len;
  dirent *p;
  char buf [4096];
  size_t path_len;
  DIR *d;
  Path *dir_local;
  
  pcVar2 = String::constData((String *)__path);
  __dirp = opendir(pcVar2);
  sVar3 = String::size((String *)__path);
  if (__dirp != (DIR *)0x0) {
    while (pdVar4 = readdir(__dirp), pdVar4 != (dirent *)0x0) {
      iVar1 = strcmp(pdVar4->d_name,".");
      if ((iVar1 != 0) && (iVar1 = strcmp(pdVar4->d_name,".."), iVar1 != 0)) {
        sVar5 = strlen(pdVar4->d_name);
        buffer.mSize = sVar3 + 2 + sVar5;
        StackBuffer<4096UL,_char>::StackBuffer((StackBuffer<4096UL,_char> *)local_2040,buffer.mSize)
        ;
        pcVar2 = StackBuffer::operator_cast_to_char_((StackBuffer *)local_2040);
        if (pcVar2 != (char *)0x0) {
          pcVar2 = StackBuffer::operator_cast_to_char_((StackBuffer *)local_2040);
          __maxlen = buffer.mSize;
          pcVar6 = String::constData((String *)__path);
          snprintf(pcVar2,__maxlen,"%s/%s",pcVar6,pdVar4->d_name);
          pcVar2 = StackBuffer::operator_cast_to_char_((StackBuffer *)local_2040);
          iVar1 = ::stat(pcVar2,(stat *)local_20e0);
          if (iVar1 == 0) {
            if (((uint)statbuf.st_nlink & 0xf000) == 0x4000) {
              pcVar2 = StackBuffer::operator_cast_to_char_((StackBuffer *)local_2040);
              Path(&local_2100,pcVar2);
              rmdir((char *)&local_2100);
              ~Path(&local_2100);
            }
            else {
              pcVar2 = StackBuffer::operator_cast_to_char_((StackBuffer *)local_2040);
              unlink(pcVar2);
            }
          }
        }
        StackBuffer<4096UL,_char>::~StackBuffer((StackBuffer<4096UL,_char> *)local_2040);
      }
    }
    closedir(__dirp);
  }
  pcVar2 = String::constData((String *)__path);
  iVar1 = ::rmdir(pcVar2);
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 == 0);
}

Assistant:

bool Path::rmdir(const Path &dir)
{
#ifdef _WIN32
    // SHFileOperation needs an absolute path.
    Path absDir = Path::resolved(dir, MakeAbsolute);
    std::wstring pathU16 = Utf8To16(dir.c_str());

    // double zero terminate the string. There *should* already be one zero
    // in c_str(), but better to be safe.
    pathU16.append(2, 0);

    // Deletion through SHFileOperation is recursive.
    SHFILEOPSTRUCTW op;
    memset(&op, 0, sizeof(SHFILEOPSTRUCTW));
    op.wFunc = FO_DELETE;
    op.pFrom = pathU16.c_str();
    op.fFlags = FOF_NO_UI;
    bool ret = (SHFileOperationW(&op) == 0);
    return ret;

#else
    DIR *d = opendir(dir.constData());
    size_t path_len = dir.size();
    union {
        char buf[PATH_MAX];
        dirent dbuf;
    };

    if (d) {
        while (dirent *p = readdir(d)) {
            /* Skip the names "." and ".." as we don't want to recurse on them. */
            if (!strcmp(p->d_name, ".") || !strcmp(p->d_name, "..")) {
                continue;
            }

            const size_t len = path_len + strlen(p->d_name) + 2;
            StackBuffer<PATH_MAX> buffer(len);

            if (buffer) {
                struct stat statbuf;
                snprintf(buffer, len, "%s/%s", dir.constData(), p->d_name);
                if (!::stat(buffer, &statbuf)) {
                    if (S_ISDIR(statbuf.st_mode)) {
                        Path::rmdir(Path(buffer));
                    } else {
                        unlink(buffer);
                    }
                }
            }
        }
        closedir(d);
    }
    return ::rmdir(dir.constData()) == 0;
#endif
}